

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.hpp
# Opt level: O1

void __thiscall
units::uncertain_measurement::uncertain_measurement
          (uncertain_measurement *this,measurement *val,measurement *uncertainty_meas)

{
  double dVar1;
  unit local_18;
  
  this->value_ = (float)val->value_;
  local_18 = val->units_;
  dVar1 = measurement::value_as(uncertainty_meas,&local_18);
  this->uncertainty_ = (float)dVar1;
  this->units_ = val->units_;
  return;
}

Assistant:

explicit uncertain_measurement(
        const measurement& val,
        const measurement& uncertainty_meas) noexcept :
        value_(static_cast<float>(val.value())),
        uncertainty_(
            static_cast<float>(uncertainty_meas.value_as(val.units()))),
        units_(val.units())
    {
    }